

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-version.c
# Opt level: O3

void test_bson_version(void)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  TestSuite *in_RDI;
  
  iVar2 = bson_get_major_version();
  if (iVar2 == 1) {
    iVar2 = bson_get_minor_version();
    if (iVar2 != 10) goto LAB_00137cdd;
    iVar2 = bson_get_micro_version();
    if (iVar2 == 0) {
      pcVar3 = (char *)bson_get_version();
      if (pcVar3 != "1.10.0-dev") {
        in_RDI = (TestSuite *)bson_get_version();
        iVar2 = strcmp((char *)in_RDI,"1.10.0-dev");
        if (iVar2 != 0) goto LAB_00137ce7;
      }
      in_RDI = (TestSuite *)0x1;
      cVar1 = bson_check_version(1,10,0);
      if (cVar1 == '\0') {
        test_bson_version_cold_5();
      }
      else {
        in_RDI = (TestSuite *)0x1;
        cVar1 = bson_check_version(1,0xb,0);
        if (cVar1 == '\0') {
          return;
        }
      }
      test_bson_version_cold_6();
      goto LAB_00137cd8;
    }
  }
  else {
LAB_00137cd8:
    test_bson_version_cold_1();
LAB_00137cdd:
    test_bson_version_cold_2();
  }
  test_bson_version_cold_3();
LAB_00137ce7:
  test_bson_version_cold_4();
  TestSuite_Add(in_RDI,"/bson/writer/custom_realloc",test_bson_writer_custom_realloc);
  TestSuite_Add(in_RDI,"/bson/writer/shared_buffer",test_bson_writer_shared_buffer);
  TestSuite_Add(in_RDI,"/bson/writer/empty_sequence",test_bson_writer_empty_sequence);
  TestSuite_Add(in_RDI,"/bson/writer/null_realloc",test_bson_writer_null_realloc);
  TestSuite_Add(in_RDI,"/bson/writer/null_realloc_2",test_bson_writer_null_realloc_2);
  return;
}

Assistant:

static void
test_bson_version (void)
{
   ASSERT_CMPINT (bson_get_major_version (), ==, BSON_MAJOR_VERSION);
   ASSERT_CMPINT (bson_get_minor_version (), ==, BSON_MINOR_VERSION);
   ASSERT_CMPINT (bson_get_micro_version (), ==, BSON_MICRO_VERSION);
   ASSERT_CMPSTR (bson_get_version (), BSON_VERSION_S);

   ASSERT (bson_check_version (
      BSON_MAJOR_VERSION, BSON_MINOR_VERSION, BSON_MICRO_VERSION));

   ASSERT (!bson_check_version (
      BSON_MAJOR_VERSION, BSON_MINOR_VERSION + 1, BSON_MICRO_VERSION));
}